

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void VisitWithStmt<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
               (ParseNode *pnode,RegSlot loc,ByteCodeGenerator *byteCodeGenerator,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  Scope *innerScope;
  ParseNodeWith *pPVar1;
  
  pPVar1 = ParseNode::AsParseNodeWith(pnode);
  innerScope = pPVar1->scope;
  ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
  pPVar1 = ParseNode::AsParseNodeWith(pnode);
  Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
            (pPVar1->pnodeBody,byteCodeGenerator,prefix,postfix,pnodeParent);
  Scope::SetIsObject(innerScope);
  innerScope->field_0x44 = innerScope->field_0x44 | 0x10;
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void VisitWithStmt(ParseNode *pnode, Js::RegSlot loc, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    // Note the fact that we're visiting the body of a with statement. This allows us to optimize register assignment
    // in the normal case of calls not requiring that their "this" objects be found dynamically.
    Scope *scope = pnode->AsParseNodeWith()->scope;

    byteCodeGenerator->PushScope(scope);
    Visit(pnode->AsParseNodeWith()->pnodeBody, byteCodeGenerator, prefix, postfix, pnodeParent);

    scope->SetIsObject();
    scope->SetMustInstantiate(true);

    byteCodeGenerator->PopScope();
}